

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall Common::File::File(File *this,FILE *fp,bool exclusive)

{
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<_IO_FILE_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Chill_Language[P]ICM_prilib_source_file_cpp:41:23),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  *p_Var1;
  undefined7 in_register_00000011;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<_IO_FILE_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Chill_Language[P]ICM_prilib_source_file_cpp:41:23),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<_IO_FILE_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Chill_Language[P]ICM_prilib_source_file_cpp:41:23),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_28;
  
  (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((int)CONCAT71(in_register_00000011,exclusive) == 0) {
    local_28._M_alloc =
         (allocator<std::_Sp_counted_deleter<_IO_FILE_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Chill_Language[P]ICM_prilib_source_file_cpp:41:23),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
          *)fp;
    local_28._M_ptr = (pointer)operator_new(0x18);
    p_Var1 = &local_28;
    local_38._M_alloc = &__a2;
    ((local_28._M_ptr)->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    ((local_28._M_ptr)->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    ((local_28._M_ptr)->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_base_00162d30;
    ((local_28._M_ptr)->_M_impl)._M_ptr = fp;
    local_38._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_deleter<_IO_FILE_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/prilib/source/file.cpp:41:23),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_38);
    std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
  }
  else {
    std::__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<_IO_FILE,int(*)(_IO_FILE*),void>
              ((__shared_ptr<_IO_FILE,(__gnu_cxx::_Lock_policy)2> *)&local_38,fp,fclose);
    std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    p_Var1 = &local_38;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var1->_M_ptr);
  return;
}

Assistant:

File::File(FILE *fp, bool exclusive) {
	if (exclusive) {
		_file = FilePtr(fp, fclose);
	}
	else {
		_file = FilePtr(fp, [](FILE*) {});
	}
}